

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O1

void cmExpandList(string_view arg,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *argsOut,bool emptyArgs)

{
  byte *pbVar1;
  byte bVar2;
  void *pvVar3;
  byte *__s;
  size_t __n_00;
  int iVar4;
  size_type __n;
  byte *pbVar5;
  byte *pbVar6;
  string newArg;
  value_type local_68;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  __s = (byte *)arg._M_str;
  __n_00 = arg._M_len;
  if (__n_00 != 0 || emptyArgs) {
    local_40._M_len = __n_00;
    local_40._M_str = (char *)__s;
    if ((__n_00 == 0) ||
       (pvVar3 = memchr(__s,0x3b,__n_00), (long)pvVar3 - (long)__s == -1 || pvVar3 == (void *)0x0))
    {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)argsOut,
                 &local_40);
    }
    else {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      local_68._M_string_length = 0;
      local_68.field_2._M_local_buf[0] = '\0';
      pbVar5 = __s + __n_00;
      iVar4 = 0;
      pbVar6 = __s;
      local_48 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)argsOut;
      do {
        bVar2 = *pbVar6;
        if (bVar2 < 0x5c) {
          if (bVar2 == 0x3b) {
            if (iVar4 == 0) {
              std::__cxx11::string::replace
                        ((ulong)&local_68,local_68._M_string_length,(char *)0x0,(ulong)__s);
              __s = pbVar6 + 1;
              iVar4 = 0;
              if (local_68._M_string_length != 0 || emptyArgs) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_48,&local_68);
                local_68._M_string_length = 0;
                *local_68._M_dataplus._M_p = '\0';
                iVar4 = 0;
              }
            }
          }
          else if (bVar2 == 0x5b) {
            iVar4 = iVar4 + 1;
          }
        }
        else if (bVar2 == 0x5d) {
          iVar4 = iVar4 + -1;
        }
        else if (((bVar2 == 0x5c) && (pbVar1 = pbVar6 + 1, pbVar1 != pbVar5)) && (*pbVar1 == 0x3b))
        {
          std::__cxx11::string::replace
                    ((ulong)&local_68,local_68._M_string_length,(char *)0x0,(ulong)__s);
          __s = pbVar1;
          pbVar6 = pbVar1;
        }
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar5);
      std::__cxx11::string::replace
                ((ulong)&local_68,local_68._M_string_length,(char *)0x0,(ulong)__s);
      if (local_68._M_string_length != 0 || emptyArgs) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_48,&local_68);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,
                        CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                 local_68.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  return;
}

Assistant:

void cmExpandList(cm::string_view arg, std::vector<std::string>& argsOut,
                  bool emptyArgs)
{
  // If argument is empty, it is an empty list.
  if (!emptyArgs && arg.empty()) {
    return;
  }

  // if there are no ; in the name then just copy the current string
  if (arg.find(';') == cm::string_view::npos) {
    argsOut.emplace_back(arg);
    return;
  }

  std::string newArg;
  // Break the string at non-escaped semicolons not nested in [].
  int squareNesting = 0;
  cm::string_view::iterator last = arg.begin();
  cm::string_view::iterator const cend = arg.end();
  for (cm::string_view::iterator c = last; c != cend; ++c) {
    switch (*c) {
      case '\\': {
        // We only want to allow escaping of semicolons.  Other
        // escapes should not be processed here.
        cm::string_view::iterator cnext = c + 1;
        if ((cnext != cend) && *cnext == ';') {
          newArg.append(last, c);
          // Skip over the escape character
          last = cnext;
          c = cnext;
        }
      } break;
      case '[': {
        ++squareNesting;
      } break;
      case ']': {
        --squareNesting;
      } break;
      case ';': {
        // Break the string here if we are not nested inside square
        // brackets.
        if (squareNesting == 0) {
          newArg.append(last, c);
          // Skip over the semicolon
          last = c + 1;
          if (!newArg.empty() || emptyArgs) {
            // Add the last argument if the string is not empty.
            argsOut.push_back(newArg);
            newArg.clear();
          }
        }
      } break;
      default: {
        // Just append this character.
      } break;
    }
  }
  newArg.append(last, cend);
  if (!newArg.empty() || emptyArgs) {
    // Add the last argument if the string is not empty.
    argsOut.push_back(std::move(newArg));
  }
}